

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O0

JSAMPARRAY alloc_sarray(j_common_ptr cinfo,int pool_id,JDIMENSION samplesperrow,JDIMENSION numrows)

{
  jpeg_memory_mgr *pjVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  JSAMPARRAY ppJVar4;
  uint local_54;
  long ltemp;
  uint local_40;
  JDIMENSION i;
  JDIMENSION currow;
  JDIMENSION rowsperchunk;
  JSAMPROW workspace;
  JSAMPARRAY result;
  my_mem_ptr mem;
  JDIMENSION numrows_local;
  JDIMENSION samplesperrow_local;
  int pool_id_local;
  j_common_ptr cinfo_local;
  
  pjVar1 = cinfo->mem;
  auVar2 = (ZEXT416(0) << 0x40 | ZEXT816(0x3b9ac9e8)) / ZEXT416(samplesperrow);
  uVar3 = auVar2._0_8_;
  if (uVar3 == 0) {
    cinfo->err->msg_code = 0x48;
    (*cinfo->err->error_exit)(cinfo);
  }
  i = numrows;
  if (uVar3 < numrows) {
    i = auVar2._0_4_;
  }
  *(JDIMENSION *)&pjVar1[1].access_virt_sarray = i;
  ppJVar4 = (JSAMPARRAY)alloc_small(cinfo,pool_id,(ulong)numrows << 3);
  local_40 = 0;
  while (local_40 < numrows) {
    if (i < numrows - local_40) {
      local_54 = i;
    }
    else {
      local_54 = numrows - local_40;
    }
    i = local_54;
    _currow = (JSAMPROW)alloc_large(cinfo,pool_id,(ulong)local_54 * (ulong)samplesperrow);
    for (ltemp._4_4_ = local_54; ltemp._4_4_ != 0; ltemp._4_4_ = ltemp._4_4_ - 1) {
      ppJVar4[local_40] = _currow;
      _currow = _currow + samplesperrow;
      local_40 = local_40 + 1;
    }
  }
  return ppJVar4;
}

Assistant:

METHODDEF(JSAMPARRAY)
alloc_sarray (j_common_ptr cinfo, int pool_id,
	      JDIMENSION samplesperrow, JDIMENSION numrows)
/* Allocate a 2-D sample array */
{
  my_mem_ptr mem = (my_mem_ptr) cinfo->mem;
  JSAMPARRAY result;
  JSAMPROW workspace;
  JDIMENSION rowsperchunk, currow, i;
  long ltemp;

  /* Calculate max # of rows allowed in one allocation chunk */
  ltemp = (MAX_ALLOC_CHUNK-SIZEOF(large_pool_hdr)) /
	  ((long) samplesperrow * SIZEOF(JSAMPLE));
  if (ltemp <= 0)
    ERREXIT(cinfo, JERR_WIDTH_OVERFLOW);
  if (ltemp < (long) numrows)
    rowsperchunk = (JDIMENSION) ltemp;
  else
    rowsperchunk = numrows;
  mem->last_rowsperchunk = rowsperchunk;

  /* Get space for row pointers (small object) */
  result = (JSAMPARRAY) alloc_small(cinfo, pool_id,
				    (size_t) (numrows * SIZEOF(JSAMPROW)));

  /* Get the rows themselves (large objects) */
  currow = 0;
  while (currow < numrows) {
    rowsperchunk = MIN(rowsperchunk, numrows - currow);
    workspace = (JSAMPROW) alloc_large(cinfo, pool_id,
	(size_t) ((size_t) rowsperchunk * (size_t) samplesperrow
		  * SIZEOF(JSAMPLE)));
    for (i = rowsperchunk; i > 0; i--) {
      result[currow++] = workspace;
      workspace += samplesperrow;
    }
  }

  return result;
}